

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O0

bool load_from_gguf(char *fname,ggml_context *ctx_ggml,gguf_context *ctx_gguf)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  void *__ptr;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  size_t nbytes_cpy;
  size_t pos;
  size_t nbytes;
  size_t offs;
  ggml_tensor *tensor;
  char *name;
  int i;
  int n_tensors;
  void *buf;
  size_t buf_size;
  FILE *f;
  size_t local_80;
  ulong local_68;
  int local_40;
  bool local_1;
  
  __stream = (FILE *)ggml_fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    local_1 = false;
  }
  else {
    __ptr = malloc(0x400000);
    iVar1 = gguf_get_n_tensors(in_RDX);
    for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
      uVar3 = gguf_get_tensor_name(in_RDX,(long)local_40);
      lVar4 = ggml_get_tensor(in_RSI,uVar3);
      if (lVar4 != 0) {
        lVar5 = gguf_get_data_offset(in_RDX);
        lVar6 = gguf_get_tensor_offset(in_RDX,(long)local_40);
        iVar2 = fseek(__stream,lVar5 + lVar6,0);
        if (iVar2 != 0) {
          fclose(__stream);
          free(__ptr);
          return false;
        }
        uVar7 = ggml_nbytes(lVar4);
        for (local_68 = 0; local_68 < uVar7; local_68 = local_68 + 0x400000) {
          if (uVar7 - local_68 < 0x400001) {
            local_80 = uVar7 - local_68;
          }
          else {
            local_80 = 0x400000;
          }
          sVar8 = fread(__ptr,1,local_80,__stream);
          if (sVar8 != local_80) {
            fclose(__stream);
            free(__ptr);
            return false;
          }
          ggml_backend_tensor_set(lVar4,__ptr,local_68,local_80);
        }
      }
    }
    fclose(__stream);
    free(__ptr);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool load_from_gguf(const char * fname, struct ggml_context * ctx_ggml, struct gguf_context * ctx_gguf) {
    FILE * f = ggml_fopen(fname, "rb");
    if (!f) {
        return false;
    }

    const size_t buf_size = 4*1024*1024;
    void * buf = malloc(buf_size);

    const int n_tensors = gguf_get_n_tensors(ctx_gguf);
    for (int i = 0; i < n_tensors; i++) {
        const char * name = gguf_get_tensor_name(ctx_gguf, i);

        struct ggml_tensor * tensor = ggml_get_tensor(ctx_ggml, name);
        if (!tensor) {
            continue;
        }

        const size_t offs = gguf_get_data_offset(ctx_gguf) + gguf_get_tensor_offset(ctx_gguf, i);

        if (fseek(f, offs, SEEK_SET) != 0) {
            fclose(f);
            free(buf);
            return false;
        }

        const size_t nbytes = ggml_nbytes(tensor);
        for (size_t pos = 0; pos < nbytes; pos += buf_size) {
            const size_t nbytes_cpy = buf_size < nbytes - pos ? buf_size : nbytes - pos;

            if (fread(buf, 1, nbytes_cpy, f) != nbytes_cpy) {
                fclose(f);
                free(buf);
                return false;
            }

            ggml_backend_tensor_set(tensor, buf, pos, nbytes_cpy);
        }
    }

    fclose(f);
    free(buf);
    return true;
}